

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O0

void Am_Text_Command_Undo_proc(Am_Object *command_obj)

{
  Am_Value local_40 [2];
  Am_Object local_20;
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *command_obj_local;
  
  local_10 = command_obj;
  Am_Object::Am_Object(&local_18,command_obj);
  Am_Object::Am_Object(&local_20,&Am_No_Object);
  Am_Value::Am_Value(local_40,&Am_No_Value);
  text_general_undo_redo(&local_18,true,false,false,&local_20,local_40);
  Am_Value::~Am_Value(local_40);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Text_Command_Undo,
                 (Am_Object command_obj))
{
  text_general_undo_redo(command_obj, true, false, false);
}